

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseStartModuleField(WastParser *this,Module *module)

{
  bool bVar1;
  size_type sVar2;
  unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_> local_f0;
  Enum local_e4;
  undefined4 local_e0;
  Enum local_dc;
  Location local_d8;
  undefined1 local_b8 [8];
  Var var;
  undefined1 local_48 [8];
  Location loc;
  Module *module_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    GetLocation((Location *)local_48,this);
    sVar2 = std::vector<wabt::Var_*,_std::allocator<wabt::Var_*>_>::size(&module->starts);
    if (sVar2 == 0) {
      var.field_2._28_4_ = Expect(this,Start);
      bVar1 = Failed((Result)var.field_2._28_4_);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        Location::Location(&local_d8);
        Var::Var((Var *)local_b8,0xffffffff,&local_d8);
        local_dc = (Enum)ParseVar(this,(Var *)local_b8);
        bVar1 = Failed((Result)local_dc);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          local_e4 = (Enum)Expect(this,Rpar);
          bVar1 = Failed((Result)local_e4);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
          else {
            MakeUnique<wabt::StartModuleField,wabt::Var&,wabt::Location&>
                      ((wabt *)&local_f0,(Var *)local_b8,(Location *)local_48);
            Module::AppendField(module,&local_f0);
            std::unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>::
            ~unique_ptr(&local_f0);
            Result::Result((Result *)((long)&this_local + 4),Ok);
          }
        }
        local_e0 = 1;
        Var::~Var((Var *)local_b8);
      }
    }
    else {
      Error(this,0x3345d7);
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseStartModuleField(Module* module) {
  WABT_TRACE(ParseStartModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  if (module->starts.size() > 0) {
    Error(loc, "multiple start sections");
    return Result::Error;
  }
  EXPECT(Start);
  Var var;
  CHECK_RESULT(ParseVar(&var));
  EXPECT(Rpar);
  module->AppendField(MakeUnique<StartModuleField>(var, loc));
  return Result::Ok;
}